

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UBool __thiscall
icu_63::CollationFastLatinBuilder::encodeUniqueCEs
          (CollationFastLatinBuilder *this,UErrorCode *errorCode)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint16_t *puVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  int iVar6;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  uprv_free_63(this->miniCEs);
  puVar7 = (uint16_t *)uprv_malloc_63((long)(this->uniqueCEs).count * 2);
  this->miniCEs = puVar7;
  if (puVar7 == (uint16_t *)0x0) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    bVar3 = false;
  }
  else {
    if (0 < (this->uniqueCEs).count) {
      uVar4 = this->lastSpecialPrimaries[0];
      lVar15 = 0;
      iVar5 = 0;
      uVar16 = 0;
      uVar12 = 0;
      uVar13 = 0;
      uVar8 = 0;
      uVar10 = 0;
      do {
        uVar1 = (this->uniqueCEs).elements[lVar15];
        uVar14 = (uint)(uVar1 >> 0x20);
        uVar11 = (uint)uVar12;
        if (uVar16 == uVar14) {
LAB_0023719b:
          uVar12 = uVar1 >> 0x10 & 0xffff;
          if ((uint)uVar12 == uVar11) {
            uVar12 = (ulong)uVar11;
            uVar14 = uVar13;
            uVar2 = uVar8;
          }
          else if (uVar10 == 0) {
            if (uVar8 == 0) {
              uVar14 = 0;
              uVar2 = 0x180;
            }
            else {
              if (0x3df < uVar8) {
                uVar10 = 0;
                goto LAB_002373b1;
              }
LAB_00237388:
              uVar14 = 0;
              uVar2 = uVar8 + 0x20;
            }
          }
          else {
            uVar14 = 0;
            if ((uint)uVar1 < 0x5000000) {
              if (uVar8 != 0xa0) {
                if (uVar8 < 0x80) goto LAB_00237388;
LAB_002373b1:
                uVar9 = 1;
                uVar12 = (ulong)uVar11;
                goto LAB_002373bc;
              }
              uVar14 = 0;
              uVar2 = 0;
            }
            else if ((uint)uVar12 == 0x500) {
              uVar12 = 0x500;
              uVar2 = 0xa0;
            }
            else {
              uVar2 = 0xc0;
              if (0xbf < uVar8) {
                if (uVar8 < 0x160) goto LAB_00237388;
                goto LAB_002373b1;
              }
            }
          }
          uVar8 = uVar2;
          if (0x500 < ((uint)uVar1 & 0x3f3f)) {
            uVar9 = 1;
            uVar13 = uVar14;
            if (6 < uVar14) goto LAB_002373bc;
            uVar14 = uVar14 + 1;
          }
          uVar13 = uVar14;
          if (uVar10 - 0xc00 < 0x3f9) {
            uVar9 = (ushort)uVar14 | (ushort)uVar10;
          }
          else {
            uVar9 = (ushort)uVar8 | (ushort)uVar10 | (ushort)uVar14;
          }
        }
        else {
          if (uVar4 < uVar14) {
            lVar17 = (long)iVar5;
            iVar6 = 3;
            if (3 < iVar5) {
              iVar6 = iVar5;
            }
            iVar5 = iVar6 + 1;
            do {
              UnicodeString::setCharAt(&this->result,(int)lVar17 + 1,(UChar)uVar10);
              if (2 < lVar17) {
                uVar4 = 0xffffffff;
                goto LAB_002372e9;
              }
              uVar4 = this->lastSpecialPrimaries[lVar17 + 1];
              lVar17 = lVar17 + 1;
            } while (uVar4 < uVar14);
            iVar5 = (int)lVar17;
          }
LAB_002372e9:
          if (this->firstShortPrimary <= uVar14) {
            uVar11 = 0x500;
            if (uVar10 < 0x1000) {
              uVar10 = 0x1000;
              uVar8 = 0xa0;
              uVar16 = uVar14;
              uVar13 = 0;
            }
            else {
              if (0xf7ff < uVar10) {
                this->shortPrimaryOverflow = '\x01';
                uVar9 = 1;
                goto LAB_002373bc;
              }
              uVar10 = uVar10 + 0x400;
              uVar8 = 0xa0;
              uVar16 = uVar14;
              uVar13 = 0;
            }
            goto LAB_0023719b;
          }
          uVar11 = 0x500;
          if (uVar10 == 0) {
            uVar10 = 0xc00;
            uVar8 = 0xa0;
            uVar16 = uVar14;
            uVar13 = 0;
            goto LAB_0023719b;
          }
          uVar9 = 1;
          if (uVar10 < 0xff8) {
            uVar10 = uVar10 + 8;
            uVar8 = 0xa0;
            uVar16 = uVar14;
            uVar13 = 0;
            goto LAB_0023719b;
          }
        }
LAB_002373bc:
        this->miniCEs[lVar15] = uVar9;
        lVar15 = lVar15 + 1;
      } while (lVar15 < (this->uniqueCEs).count);
    }
    bVar3 = *errorCode < U_ILLEGAL_ARGUMENT_ERROR;
  }
  return bVar3;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }